

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftpack.c
# Opt level: O0

int c1fm1f_(int *n,int *inc,fft_complex_t *c__,double *ch,double *wa,double *fnf,double *fac)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int *ido_00;
  double *wa_00;
  double *in_RCX;
  double *cc;
  double *in_RDX;
  int *unaff_RBX;
  int *in_RSI;
  double *in_RDI;
  long in_R8;
  double *in_R9;
  double *unaff_R14;
  int *unaff_R15;
  int *unaff_retaddr;
  long in_stack_00000008;
  int *in_stack_00000020;
  double *in_stack_00000028;
  int inc2;
  int nbr;
  int ido;
  int lid;
  int iw;
  int ip;
  int nf;
  int na;
  int l2;
  int l1;
  int k1;
  int i__2;
  int i__1;
  double *in_stack_ffffffffffffff50;
  int *in_stack_ffffffffffffff58;
  double *in_stack_ffffffffffffff60;
  int *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff78;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  
  ido_00 = (int *)(in_stack_00000008 + -8);
  wa_00 = (double *)(in_R8 + -8);
  iVar2 = *in_RSI + *in_RSI;
  iVar3 = (int)*in_R9;
  iVar11 = 0;
  iVar10 = 1;
  iVar13 = 1;
  iVar12 = 1;
  iVar14 = iVar3;
  do {
    if (iVar14 < iVar13) {
      return 0;
    }
    iVar4 = (int)*(double *)(ido_00 + (long)iVar13 * 2);
    iVar5 = iVar4 * iVar12;
    iVar6 = *(int *)in_RDI / iVar5;
    iVar7 = iVar4 + -2;
    iVar8 = iVar11 + 1;
    iVar9 = iVar7;
    if (3 < iVar7) {
      iVar9 = 4;
    }
    iVar1 = iVar8 + iVar9 * 2;
    cc = (double *)(ulong)(iVar1 - 1);
    switch(cc) {
    case (double *)0x0:
    default:
      c1f2kf_((int *)&stack0xffffffffffffff8c,(int *)&stack0xffffffffffffffa8,
              (int *)&stack0xffffffffffffffa0,in_RDX,(int *)&stack0xffffffffffffff84,in_RCX,&c__2,
              wa_00 + iVar10);
      break;
    case (double *)0x1:
      c1f2kf_((int *)&stack0xffffffffffffff8c,(int *)&stack0xffffffffffffffa8,
              (int *)&stack0xffffffffffffffa0,in_RCX,&c__2,in_RDX,(int *)&stack0xffffffffffffff84,
              wa_00 + iVar10);
      break;
    case (double *)0x2:
      c1f3kf_((int *)CONCAT44(iVar9,in_stack_ffffffffffffff78),(int *)cc,in_stack_ffffffffffffff68,
              in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
              (int *)CONCAT44(iVar10,iVar12 * iVar6),(double *)CONCAT44(iVar3,iVar4));
      break;
    case (double *)0x3:
      c1f3kf_((int *)CONCAT44(iVar9,in_stack_ffffffffffffff78),(int *)cc,in_stack_ffffffffffffff68,
              in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
              (int *)CONCAT44(iVar10,iVar12 * iVar6),(double *)CONCAT44(iVar3,iVar4));
      break;
    case (double *)0x4:
      c1f4kf_((int *)CONCAT44(iVar6,iVar1),(int *)CONCAT44(iVar2,iVar8),
              (int *)CONCAT44(iVar9,in_stack_ffffffffffffff78),cc,in_stack_ffffffffffffff68,
              in_stack_ffffffffffffff60,(int *)CONCAT44(iVar5,iVar11),
              (double *)CONCAT44(iVar13,iVar12));
      break;
    case (double *)0x5:
      c1f4kf_((int *)CONCAT44(iVar6,iVar1),(int *)CONCAT44(iVar2,iVar8),
              (int *)CONCAT44(iVar9,in_stack_ffffffffffffff78),cc,in_stack_ffffffffffffff68,
              in_stack_ffffffffffffff60,(int *)CONCAT44(iVar5,iVar11),
              (double *)CONCAT44(iVar13,iVar12));
      break;
    case (double *)0x6:
      c1f5kf_(ido_00,unaff_retaddr,unaff_R15,unaff_R14,unaff_RBX,in_RDI,in_stack_00000020,
              in_stack_00000028);
      break;
    case (double *)0x7:
      c1f5kf_(ido_00,unaff_retaddr,unaff_R15,unaff_R14,unaff_RBX,in_RDI,in_stack_00000020,
              in_stack_00000028);
      break;
    case (double *)0x8:
      in_stack_ffffffffffffff60 = wa_00 + iVar10;
      in_stack_ffffffffffffff58 = &c__2;
      in_stack_ffffffffffffff50 = in_RCX;
      c1fgkf_((int *)CONCAT44(iVar2,iVar8),(int *)CONCAT44(iVar9,in_stack_ffffffffffffff78),
              (int *)cc,in_stack_ffffffffffffff68,(int *)in_stack_ffffffffffffff60,(double *)&c__2,
              (double *)CONCAT44(iVar3,iVar4),(int *)CONCAT44(iVar5,iVar11),
              (double *)CONCAT44(iVar13,iVar12),(double *)CONCAT44(iVar14,iVar7),(int *)in_R9,wa_00)
      ;
      break;
    case (double *)0x9:
      in_stack_ffffffffffffff60 = wa_00 + iVar10;
      in_stack_ffffffffffffff58 = (int *)&stack0xffffffffffffff84;
      in_stack_ffffffffffffff50 = in_RDX;
      c1fgkf_((int *)CONCAT44(iVar2,iVar8),(int *)CONCAT44(iVar9,in_stack_ffffffffffffff78),
              (int *)cc,in_stack_ffffffffffffff68,(int *)in_stack_ffffffffffffff60,
              (double *)in_stack_ffffffffffffff58,(double *)CONCAT44(iVar3,iVar4),
              (int *)CONCAT44(iVar5,iVar11),(double *)CONCAT44(iVar13,iVar12),
              (double *)CONCAT44(iVar14,iVar7),(int *)in_R9,wa_00);
    }
    iVar10 = (iVar4 + -1) * iVar6 * 2 + iVar10;
    if (iVar4 < 6) {
      iVar11 = 1 - iVar11;
    }
    iVar13 = iVar13 + 1;
    iVar12 = iVar5;
  } while( true );
}

Assistant:

int c1fm1f_(int *n, int *inc, complex *c__, fft_real_t *ch,
	 fft_real_t *wa, fft_real_t *fnf, fft_real_t *fac)
{
    /* System generated locals */
    int i__1, i__2;

    /* Local variables */
     int k1, l1, l2, na, nf, ip, iw, lid, ido, nbr, inc2;
    extern /* Subroutine */ int c1f2kf_(int *, int *, int *, fft_real_t
	    *, int *, fft_real_t *, int *, fft_real_t *), c1f3kf_(int *,
	    int *, int *, fft_real_t *, int *, fft_real_t *, int *, fft_real_t *
	    ), c1f4kf_(int *, int *, int *, fft_real_t *, int *,
	    fft_real_t *, int *, fft_real_t *), c1f5kf_(int *, int *, int
	    *, fft_real_t *, int *, fft_real_t *, int *, fft_real_t *), c1fgkf_(int
	    *, int *, int *, int *, int *, fft_real_t *, fft_real_t *,
	    int *, fft_real_t *, fft_real_t *, int *, fft_real_t *);


/* FFTPACK 5.1 auxiliary routine */

    /* Parameter adjustments */
    --fac;
    --wa;
    --ch;
    --c__;

    /* Function Body */
    inc2 = *inc + *inc;
    nf = *fnf;
    na = 0;
    l1 = 1;
    iw = 1;
    i__1 = nf;
    for (k1 = 1; k1 <= i__1; ++k1) {
	ip = fac[k1];
	l2 = ip * l1;
	ido = *n / l2;
	lid = l1 * ido;
/* Computing MIN */
	i__2 = ip - 2;
	nbr = na + 1 + (min(i__2,4) << 1);
	switch (nbr) {
	    case 1:  goto L52;
	    case 2:  goto L62;
	    case 3:  goto L53;
	    case 4:  goto L63;
	    case 5:  goto L54;
	    case 6:  goto L64;
	    case 7:  goto L55;
	    case 8:  goto L65;
	    case 9:  goto L56;
	    case 10:  goto L66;
	}
L52:
	c1f2kf_(&ido, &l1, &na, (fft_real_t*)&c__[1], &inc2, &ch[1], &c__2, &wa[iw])
		;
	goto L120;
L62:
	c1f2kf_(&ido, &l1, &na, &ch[1], &c__2, (fft_real_t*)&c__[1], &inc2, &wa[iw])
		;
	goto L120;
L53:
	c1f3kf_(&ido, &l1, &na, (fft_real_t*)&c__[1], &inc2, &ch[1], &c__2, &wa[iw])
		;
	goto L120;
L63:
	c1f3kf_(&ido, &l1, &na, &ch[1], &c__2, (fft_real_t*)&c__[1], &inc2, &wa[iw])
		;
	goto L120;
L54:
	c1f4kf_(&ido, &l1, &na, (fft_real_t*)&c__[1], &inc2, &ch[1], &c__2, &wa[iw])
		;
	goto L120;
L64:
	c1f4kf_(&ido, &l1, &na, &ch[1], &c__2, (fft_real_t*)&c__[1], &inc2, &wa[iw])
		;
	goto L120;
L55:
	c1f5kf_(&ido, &l1, &na, (fft_real_t*)&c__[1], &inc2, &ch[1], &c__2, &wa[iw])
		;
	goto L120;
L65:
	c1f5kf_(&ido, &l1, &na, &ch[1], &c__2, (fft_real_t*)&c__[1], &inc2, &wa[iw])
		;
	goto L120;
L56:
	c1fgkf_(&ido, &ip, &l1, &lid, &na, (fft_real_t*)&c__[1], (fft_real_t*)&c__[1], &
		inc2, &ch[1], &ch[1], &c__2, &wa[iw]);
	goto L120;
L66:
	c1fgkf_(&ido, &ip, &l1, &lid, &na, &ch[1], &ch[1], &c__2, (fft_real_t*)&c__[
		1], (fft_real_t*)&c__[1], &inc2, &wa[iw]);
L120:
	l1 = l2;
	iw += (ip - 1) * (ido + ido);
	if (ip <= 5) {
	    na = 1 - na;
	}
/* L125: */
    }
    return 0;
}